

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Prs_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Prs_Ntk_t *p;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  Vec_Str_t *p_00;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int *piVar17;
  Vec_Int_t *vSigs [4];
  char *pTypeNames [90];
  Vec_Int_t *local_348 [4];
  Vec_Int_t *local_328 [4];
  undefined8 local_308 [8];
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_50;
  char *local_48;
  char *local_40;
  
  if (vPrs->nSize < 1) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  memset(local_308,0,0x2d0);
  local_48 = "sli";
  local_40 = "icc";
  local_2c8 = "";
  local_2c0 = "~";
  local_2b8 = "&";
  local_2b0 = "&";
  local_2a8 = "|";
  local_2a0 = "|";
  local_298 = "^";
  local_290 = "^";
  local_288 = "&";
  local_280 = "&";
  local_278 = "?";
  local_270 = "maj";
  local_230 = "&";
  local_228 = "~&";
  local_220 = "|";
  local_218 = "~|";
  local_210 = "^";
  local_208 = "~^";
  local_200 = "!";
  local_1f8 = "&&";
  local_1f0 = "logic nand";
  local_1e8 = "||";
  local_1e0 = "logic nor";
  local_1d8 = "^^";
  local_1d0 = "logic xnor";
  local_1c8 = "nmux";
  local_1c0 = "sel";
  local_1b8 = "prio-select";
  local_1b0 = "enc";
  local_1a8 = "prio-enc";
  local_1a0 = "dec";
  local_198 = "enable-dec";
  local_190 = "+";
  local_188 = "-";
  local_180 = "*";
  local_170 = "/";
  local_168 = "%";
  local_160 = "%";
  local_158 = "**";
  local_150 = "-";
  local_148 = "@";
  local_140 = "abs";
  local_130 = "<";
  local_128 = "<=";
  local_120 = ">=";
  local_118 = ">";
  local_110 = "==";
  local_108 = "!=";
  local_100 = "<<";
  local_f8 = ">>";
  local_f0 = "<<<";
  local_e8 = ">>>";
  local_e0 = "rotL";
  local_d8 = "rotR";
  local_b0 = "tri";
  local_a8 = "ram";
  local_a0 = "ramR";
  local_98 = "ramW";
  local_90 = "ramWC";
  local_78 = "ramBox";
  local_70 = "lat";
  local_68 = "latrs";
  local_60 = "dff";
  local_50 = "dffrs";
  pcVar7 = Abc_NamStr(*(Abc_Nam_t **)(piVar17 + 2),*piVar17);
  pcVar8 = Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar7,pcVar8);
  if (0 < vPrs->nSize) {
    lVar11 = 0;
    do {
      p = (Prs_Ntk_t *)vPrs->pArray[lVar11];
      pcVar7 = Prs_ObjGetName(p,p->iModuleName);
      fprintf(__stream,"module %s (\n    ",pcVar7);
      if (0 < (p->vOrder).nSize) {
        uVar13 = 0;
        do {
          uVar6 = (p->vOrder).pArray[uVar13];
          if ((int)uVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x11a,"int Abc_Lit2Var2(int)");
          }
          pcVar8 = Prs_ObjGetName(p,uVar6 >> 2);
          pcVar7 = "    \"%s\", ";
          if (uVar13 == (p->vOrder).nSize - 1) {
            pcVar7 = "T = %d\t\t";
          }
          fprintf(__stream,"%s%s",pcVar8,pcVar7 + 8);
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)(p->vOrder).nSize);
      }
      fwrite("\n  );\n",6,1,__stream);
      lVar14 = 0;
      do {
        local_328[0] = &p->vInouts;
        local_328[1] = &p->vInputs;
        local_328[2] = &p->vOutputs;
        local_328[3] = &p->vWires;
        local_348[0] = &p->vInoutsR;
        local_348[1] = &p->vInputsR;
        local_348[2] = &p->vOutputsR;
        local_348[3] = &p->vWiresR;
        if (lVar14 == 3) {
          fputc(10,__stream);
        }
        pVVar2 = local_328[lVar14];
        if (0 < pVVar2->nSize) {
          pVVar3 = local_348[lVar14];
          lVar15 = 0;
          do {
            if (pVVar3->nSize <= lVar15) goto LAB_0034e23f;
            uVar6 = pVVar3->pArray[lVar15];
            if ((int)uVar6 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10d,"int Abc_LitIsCompl(int)");
            }
            iVar12 = pVVar2->pArray[lVar15];
            iVar1 = *(int *)(&DAT_008441e4 + lVar14 * 4);
            pcVar7 = "signed ";
            if ((uVar6 & 1) == 0) {
              pcVar7 = "";
            }
            pcVar8 = "";
            if (uVar6 != 0) {
              uVar9 = uVar6 >> 1;
              uVar10 = 0;
              uVar16 = 0;
              if (uVar6 != 1) {
                pVVar4 = p->vHash->vObjs;
                if (pVVar4->nSize <= (int)(uVar9 * 4)) goto LAB_0034e27d;
                uVar16 = pVVar4->pArray[(ulong)uVar9 * 4];
              }
              if (uVar6 != 1) {
                pVVar4 = p->vHash->vObjs;
                uVar10 = uVar9 * 4;
                uVar6 = pVVar4->nSize;
                if (uVar6 == uVar10 || SBORROW4(uVar6,uVar10) != (int)(uVar6 + uVar9 * -4) < 0)
                goto LAB_0034e27d;
                uVar10 = pVVar4->pArray[(ulong)uVar10 + 1];
              }
              p_00 = Abc_NamBuffer(p->pStrs);
              pcVar8 = Vec_StrPrintF(p_00,"[%d:%d]",(ulong)uVar16,(ulong)uVar10);
            }
            fprintf(__stream,"  %s %s%s",&DAT_008441e4 + iVar1,pcVar7,pcVar8);
            pcVar7 = Prs_ObjGetName(p,iVar12);
            fprintf(__stream,"%s;\n",pcVar7);
            lVar15 = lVar15 + 1;
          } while (lVar15 < pVVar2->nSize);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      fputc(10,__stream);
      if (0 < (p->vObjs).nSize) {
        lVar14 = 0;
        do {
          piVar17 = (p->vObjs).pArray;
          iVar12 = piVar17[lVar14];
          if (((long)iVar12 < 0) || (iVar1 = (p->vBoxes).nSize, iVar1 <= iVar12)) {
LAB_0034e23f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar5 = (p->vBoxes).pArray;
          Prs_BoxSignals_V_1 = piVar5[iVar12] - 2;
          iVar12 = piVar17[lVar14];
          if (((long)iVar12 < -3) || (iVar1 <= (int)(iVar12 + 3U))) {
LAB_0034e27d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Prs_BoxSignals_V_2 = piVar5 + (iVar12 + 3U);
          if (iVar12 < -1) goto LAB_0034e23f;
          uVar6 = piVar5[(long)iVar12 + 1];
          uVar13 = (ulong)uVar6;
          if ((uVar13 == 0x12) && (*Prs_BoxSignals_V_2 == 0)) {
            if (Prs_BoxSignals_V_1 != 8) {
              __assert_fail("Vec_IntSize(vSigs) == 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                            ,0xdd,"void Prs_ManWriteVerilogMux(FILE *, Prs_Ntk_t *, Vec_Int_t *)");
            }
            fwrite("  assign ",9,1,__stream);
            if ((int)Prs_BoxSignals_V_1 < 2) goto LAB_0034e23f;
            Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[1]);
            fputs(" = ",__stream);
            if (3 < (int)Prs_BoxSignals_V_1) {
              iVar12 = 3;
              lVar15 = 1;
              do {
                Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[lVar15 * 2 + 1]);
                fputs(&DAT_008441f4 +
                      *(int *)(&DAT_008441f4 + (ulong)((uint)lVar15 & 0x7fffffff) * 4),__stream);
                iVar12 = iVar12 + 2;
                lVar15 = lVar15 + 1;
              } while (iVar12 < (int)Prs_BoxSignals_V_1);
            }
          }
          else if (*Prs_BoxSignals_V_2 == 0) {
            fwrite("  assign ",9,1,__stream);
            if ((int)Prs_BoxSignals_V_1 < 2) goto LAB_0034e23f;
            Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[1]);
            fwrite(" = ",3,1,__stream);
            if (((uVar6 < 0x3a) && ((0x380000200000300U >> (uVar13 & 0x3f) & 1) != 0)) ||
               (0xfffffff9 < uVar6 - 0x21)) {
              fputs((char *)local_308[uVar13],__stream);
              lVar15 = 0xc;
              if ((int)Prs_BoxSignals_V_1 < 4) goto LAB_0034e23f;
LAB_0034df30:
              Prs_ManWriteVerilogSignal
                        ((FILE *)__stream,p,*(int *)((long)Prs_BoxSignals_V_2 + lVar15));
            }
            else {
              if (uVar13 == 0x2f) {
                if (3 < (int)Prs_BoxSignals_V_1) {
                  if (Prs_BoxSignals_V_2[3] != 0) {
                    Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
                    fprintf(__stream," %s ",local_190);
                  }
                  if (5 < (int)Prs_BoxSignals_V_1) {
                    Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[5]);
                    fprintf(__stream," %s ",local_190);
                    lVar15 = 0x1c;
                    if (7 < (int)Prs_BoxSignals_V_1) goto LAB_0034df30;
                  }
                }
                goto LAB_0034e23f;
              }
              if (uVar6 != 0x28) {
                if (3 < (int)Prs_BoxSignals_V_1) {
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
                  fprintf(__stream," %s ",local_308[uVar13]);
                  lVar15 = 0x14;
                  if (5 < (int)Prs_BoxSignals_V_1) goto LAB_0034df30;
                }
                goto LAB_0034e23f;
              }
              if ((int)Prs_BoxSignals_V_1 < 4) goto LAB_0034e23f;
              Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
              fwrite(" ? ",3,1,__stream);
              if (5 < (int)Prs_BoxSignals_V_1) {
                uVar13 = 5;
                do {
                  if (5 < uVar13) {
                    fwrite(" : ",3,1,__stream);
                  }
                  if ((long)(int)Prs_BoxSignals_V_1 <= (long)uVar13) goto LAB_0034e23f;
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[uVar13]);
                  uVar13 = uVar13 + 2;
                } while ((int)uVar13 < (int)Prs_BoxSignals_V_1);
              }
            }
            fwrite(";\n",2,1,__stream);
          }
          else {
            pcVar7 = Prs_ObjGetName(p,uVar6);
            if ((((p->vObjs).nSize <= lVar14) || (iVar12 = (p->vObjs).pArray[lVar14], iVar12 < -2))
               || (uVar6 = iVar12 + 2, (p->vBoxes).nSize <= (int)uVar6)) goto LAB_0034e23f;
            iVar12 = (p->vBoxes).pArray[uVar6];
            pcVar8 = "";
            if (iVar12 != 0) {
              pcVar8 = Prs_ObjGetName(p,iVar12);
            }
            fprintf(__stream,"  %s %s ( ",pcVar7,pcVar8);
            if ((Prs_BoxSignals_V_1 & 1) != 0) {
              __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                            ,0xcf,"void Prs_ManWriteVerilogArray2(FILE *, Prs_Ntk_t *, Vec_Int_t *)"
                           );
            }
            if (1 < (int)Prs_BoxSignals_V_1) {
              lVar15 = 1;
              do {
                iVar12 = Prs_BoxSignals_V_2[lVar15 + -1];
                iVar1 = Prs_BoxSignals_V_2[lVar15];
                fputc(0x2e,__stream);
                pcVar7 = Prs_ObjGetName(p,iVar12);
                fputs(pcVar7,__stream);
                fputc(0x28,__stream);
                Prs_ManWriteVerilogSignal((FILE *)__stream,p,iVar1);
                pcVar7 = "    \"%s\", ";
                if (lVar15 - 1U == (ulong)(Prs_BoxSignals_V_1 - 2)) {
                  pcVar7 = "T = %d\t\t";
                }
                fprintf(__stream,")%s",pcVar7 + 8);
                lVar15 = lVar15 + 2;
              } while ((int)lVar15 < (int)Prs_BoxSignals_V_1);
            }
            fwrite(" );\n",4,1,__stream);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (p->vObjs).nSize);
      }
      fwrite("endmodule\n\n",0xb,1,__stream);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Prs_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    char * pTypeNames[CBA_BOX_LAST];
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Cba_ManCreatePrimMap( pTypeNames );
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteVerilogNtk( pFile, pNtk, pTypeNames );
    fclose( pFile );
}